

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefifind.cpp
# Opt level: O0

USTATUS __thiscall
UEFIFind::find(UEFIFind *this,UINT8 mode,bool count,CBString *hexPattern,CBString *result)

{
  TreeModel *__s;
  UModelIndex index;
  EFI_GUID_ EVar1;
  bool bVar2;
  UINT8 UVar3;
  size_type sVar4;
  reference ppVar5;
  EFI_GUID_ *v;
  char *pcVar6;
  EFI_GUID_ EVar7;
  CBString local_240;
  EFI_GUID_ local_228;
  CBString local_218;
  CBString local_200;
  CBString local_1e8;
  UByteArray local_1d0;
  EFI_GUID_ local_1b0;
  CBString local_1a0;
  UByteArray local_188;
  UByteArray local_168;
  undefined1 auStack_148 [8];
  pair<UModelIndex,_UModelIndex> indexes;
  UByteArray data;
  _Self local_f0;
  const_iterator citer;
  USTATUS returned;
  undefined1 local_90 [8];
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  files;
  undefined1 auStack_48 [8];
  UModelIndex root;
  CBString *result_local;
  CBString *hexPattern_local;
  bool count_local;
  UINT8 mode_local;
  UEFIFind *this_local;
  
  __s = this->model;
  root.m = (TreeModel *)result;
  UModelIndex::UModelIndex((UModelIndex *)&files._M_t._M_impl.super__Rb_tree_header._M_node_count);
  TreeModel::index((TreeModel *)auStack_48,(char *)__s,0);
  std::
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  ::set((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
         *)local_90);
  Bstrlib::CBString::clear((CBString *)root.m);
  index.i._0_4_ = root.r;
  index.i._4_4_ = root.c;
  index.r = auStack_48._0_4_;
  index.c = auStack_48._4_4_;
  index.m = (TreeModel *)root.i;
  this_local = (UEFIFind *)
               findFileRecursive(this,index,hexPattern,mode,
                                 (set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                                  *)local_90);
  EVar1.Data4[0] = local_1b0.Data4[0];
  EVar1.Data4[1] = local_1b0.Data4[1];
  EVar1.Data4[2] = local_1b0.Data4[2];
  EVar1.Data4[3] = local_1b0.Data4[3];
  EVar1.Data4[4] = local_1b0.Data4[4];
  EVar1.Data4[5] = local_1b0.Data4[5];
  EVar1.Data4[6] = local_1b0.Data4[6];
  EVar1.Data4[7] = local_1b0.Data4[7];
  EVar1.Data1 = local_1b0.Data1;
  EVar1.Data2 = local_1b0.Data2;
  EVar1.Data3 = local_1b0.Data3;
  EVar7.Data4[0] = local_228.Data4[0];
  EVar7.Data4[1] = local_228.Data4[1];
  EVar7.Data4[2] = local_228.Data4[2];
  EVar7.Data4[3] = local_228.Data4[3];
  EVar7.Data4[4] = local_228.Data4[4];
  EVar7.Data4[5] = local_228.Data4[5];
  EVar7.Data4[6] = local_228.Data4[6];
  EVar7.Data4[7] = local_228.Data4[7];
  EVar7.Data1 = local_228.Data1;
  EVar7.Data2 = local_228.Data2;
  EVar7.Data3 = local_228.Data3;
  if (this_local == (UEFIFind *)0x0) {
    if (count) {
      bVar2 = std::
              set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
              ::empty((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                       *)local_90);
      if (!bVar2) {
        sVar4 = std::
                set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                ::size((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                        *)local_90);
        usprintf((CBString *)&citer,"%lu\n",sVar4);
        Bstrlib::CBString::operator+=((CBString *)root.m,(CBString *)&citer);
        Bstrlib::CBString::~CBString((CBString *)&citer);
      }
      EVar1.Data4[0] = local_1b0.Data4[0];
      EVar1.Data4[1] = local_1b0.Data4[1];
      EVar1.Data4[2] = local_1b0.Data4[2];
      EVar1.Data4[3] = local_1b0.Data4[3];
      EVar1.Data4[4] = local_1b0.Data4[4];
      EVar1.Data4[5] = local_1b0.Data4[5];
      EVar1.Data4[6] = local_1b0.Data4[6];
      EVar1.Data4[7] = local_1b0.Data4[7];
      EVar1.Data1 = local_1b0.Data1;
      EVar1.Data2 = local_1b0.Data2;
      EVar1.Data3 = local_1b0.Data3;
      EVar7.Data4[0] = local_228.Data4[0];
      EVar7.Data4[1] = local_228.Data4[1];
      EVar7.Data4[2] = local_228.Data4[2];
      EVar7.Data4[3] = local_228.Data4[3];
      EVar7.Data4[4] = local_228.Data4[4];
      EVar7.Data4[5] = local_228.Data4[5];
      EVar7.Data4[6] = local_228.Data4[6];
      EVar7.Data4[7] = local_228.Data4[7];
      EVar7.Data1 = local_228.Data1;
      EVar7.Data2 = local_228.Data2;
      EVar7.Data3 = local_228.Data3;
      this_local = (UEFIFind *)0x0;
    }
    else {
      local_f0._M_node =
           (_Base_ptr)
           std::
           set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
           ::begin((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                    *)local_90);
      while( true ) {
        data.d.field_2._8_8_ =
             std::
             set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
             ::end((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
                    *)local_90);
        bVar2 = std::operator!=(&local_f0,(_Self *)((long)&data.d.field_2 + 8));
        if (!bVar2) break;
        UByteArray::UByteArray((UByteArray *)&indexes.second.m,0x10,'\0');
        ppVar5 = std::_Rb_tree_const_iterator<std::pair<UModelIndex,_UModelIndex>_>::operator*
                           (&local_f0);
        auStack_148._0_4_ = (ppVar5->first).r;
        auStack_148._4_4_ = (ppVar5->first).c;
        indexes.first._0_8_ = (ppVar5->first).i;
        indexes.first.i = (uint64_t)(ppVar5->first).m;
        indexes.first.m = *(TreeModel **)&ppVar5->second;
        indexes.second._0_8_ = (ppVar5->second).i;
        indexes.second.i = (uint64_t)(ppVar5->second).m;
        bVar2 = TreeModel::hasEmptyHeader(this->model,(UModelIndex *)auStack_148);
        if (!bVar2) {
          TreeModel::header(&local_188,this->model,(UModelIndex *)auStack_148);
          UByteArray::left(&local_168,&local_188,0x10);
          UByteArray::operator=((UByteArray *)&indexes.second.m,&local_168);
          UByteArray::~UByteArray(&local_168);
          UByteArray::~UByteArray(&local_188);
        }
        v = (EFI_GUID_ *)UByteArray::constData((UByteArray *)&indexes.second.m);
        EVar7 = readUnaligned<EFI_GUID_>(v);
        local_1b0 = EVar7;
        guidToUString(&local_1a0,&local_1b0,true);
        Bstrlib::CBString::operator+=((CBString *)root.m,&local_1a0);
        Bstrlib::CBString::~CBString(&local_1a0);
        bVar2 = UModelIndex::isValid((UModelIndex *)&indexes.first.m);
        if (bVar2) {
          UVar3 = TreeModel::subtype(this->model,(UModelIndex *)&indexes.first.m);
          if (UVar3 == '\x18') {
            TreeModel::header(&local_1d0,this->model,(UModelIndex *)&indexes.first.m);
            UByteArray::operator=((UByteArray *)&indexes.second.m,&local_1d0);
            UByteArray::~UByteArray(&local_1d0);
            Bstrlib::CBString::CBString(&local_200," ");
            pcVar6 = UByteArray::constData((UByteArray *)&indexes.second.m);
            EVar7 = readUnaligned<EFI_GUID_>((EFI_GUID_ *)(pcVar6 + 4));
            local_228 = EVar7;
            guidToUString(&local_218,&local_228,true);
            Bstrlib::CBString::operator+(&local_1e8,&local_200,&local_218);
            Bstrlib::CBString::operator+=((CBString *)root.m,&local_1e8);
            Bstrlib::CBString::~CBString(&local_1e8);
            Bstrlib::CBString::~CBString(&local_218);
            Bstrlib::CBString::~CBString(&local_200);
          }
        }
        Bstrlib::CBString::CBString(&local_240,"\n");
        Bstrlib::CBString::operator+=((CBString *)root.m,&local_240);
        Bstrlib::CBString::~CBString(&local_240);
        UByteArray::~UByteArray((UByteArray *)&indexes.second.m);
        std::_Rb_tree_const_iterator<std::pair<UModelIndex,_UModelIndex>_>::operator++(&local_f0);
      }
      this_local = (UEFIFind *)0x0;
      EVar7 = local_228;
      EVar1 = local_1b0;
    }
  }
  local_228 = EVar7;
  local_1b0 = EVar1;
  std::
  set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
  ::~set((set<std::pair<UModelIndex,_UModelIndex>,_std::less<std::pair<UModelIndex,_UModelIndex>_>,_std::allocator<std::pair<UModelIndex,_UModelIndex>_>_>
          *)local_90);
  return (USTATUS)this_local;
}

Assistant:

USTATUS UEFIFind::find(const UINT8 mode, const bool count, const UString & hexPattern, UString & result)
{
    UModelIndex root = model->index(0, 0);
    std::set<std::pair<UModelIndex, UModelIndex> > files;

    result.clear();

    USTATUS returned = findFileRecursive(root, hexPattern, mode, files);
    if (returned)
        return returned;
    
    if (count) {
        if (!files.empty())
            result += usprintf("%lu\n", files.size());
        return U_SUCCESS;
    }

    for (std::set<std::pair<UModelIndex, UModelIndex> >::const_iterator citer = files.begin(); citer != files.end(); ++citer) {
        UByteArray data(16, '\x00');
        std::pair<UModelIndex, UModelIndex> indexes = *citer;
        if (!model->hasEmptyHeader(indexes.first))
            data = model->header(indexes.first).left(16);
        result += guidToUString(readUnaligned((const EFI_GUID*)data.constData()));

        // Special case of freeform subtype GUID files
        if (indexes.second.isValid() && model->subtype(indexes.second) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
            data = model->header(indexes.second);
            result += UString(" ") + (guidToUString(readUnaligned((const EFI_GUID*)(data.constData() + sizeof(EFI_COMMON_SECTION_HEADER)))));
        }
        
        result += UString("\n");
    }
    return U_SUCCESS;
}